

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void VW::start_parser(vw *all)

{
  vw *local_20;
  thread local_18;
  
  local_20 = all;
  std::thread::thread<void(&)(vw*),vw*,void>(&local_18,main_parse_loop,&local_20);
  std::thread::operator=(&all->parse_thread,&local_18);
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void start_parser(vw& all) { all.parse_thread = std::thread(main_parse_loop, &all); }